

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::WFXMLScanner::commonInit(WFXMLScanner *this)

{
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  ValueVectorOf<unsigned_long> *this_01;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_02;
  RefVectorOf<xercesc_4_0::XMLElementDecl> *this_03;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *this_04;
  
  this_00 = (ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::ValueHashTableOf
            (this_00,0xb,(this->super_XMLScanner).fMemoryManager);
  this->fEntityTable = this_00;
  this_01 = (ValueVectorOf<unsigned_long> *)
            XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  ValueVectorOf<unsigned_long>::ValueVectorOf
            (this_01,0x10,(this->super_XMLScanner).fMemoryManager,false);
  this->fAttrNameHashList = this_01;
  this_02 = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)
            XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  ValueVectorOf<xercesc_4_0::XMLAttr_*>::ValueVectorOf
            (this_02,8,(this->super_XMLScanner).fMemoryManager,false);
  this->fAttrNSList = this_02;
  this_03 = (RefVectorOf<xercesc_4_0::XMLElementDecl> *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  RefVectorOf<xercesc_4_0::XMLElementDecl>::RefVectorOf
            (this_03,0x20,true,(this->super_XMLScanner).fMemoryManager);
  this->fElements = this_03;
  this_04 = (RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x38,(this->super_XMLScanner).fMemoryManager);
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::RefHashTableOf
            (this_04,0x6d,false,(this->super_XMLScanner).fMemoryManager);
  this->fElementLookup = this_04;
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,&XMLUni::fgAmp,L"&<>\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,&XMLUni::fgLT,L"<>\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,&XMLUni::fgGT,L">\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,XMLUni::fgQuot,L"\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,XMLUni::fgApos,L"\'[>");
  return;
}

Assistant:

void WFXMLScanner::commonInit()
{
    fEntityTable = new (fMemoryManager) ValueHashTableOf<XMLCh>(11, fMemoryManager);
    fAttrNameHashList = new (fMemoryManager)ValueVectorOf<XMLSize_t>(16, fMemoryManager);
    fAttrNSList = new (fMemoryManager) ValueVectorOf<XMLAttr*>(8, fMemoryManager);
    fElements = new (fMemoryManager) RefVectorOf<XMLElementDecl>(32, true, fMemoryManager);
    fElementLookup = new (fMemoryManager) RefHashTableOf<XMLElementDecl>(109, false, fMemoryManager);

    //  Add the default entity entries for the character refs that must always
    //  be present.
    fEntityTable->put((void*) XMLUni::fgAmp, chAmpersand);
    fEntityTable->put((void*) XMLUni::fgLT, chOpenAngle);
    fEntityTable->put((void*) XMLUni::fgGT, chCloseAngle);
    fEntityTable->put((void*) XMLUni::fgQuot, chDoubleQuote);
    fEntityTable->put((void*) XMLUni::fgApos, chSingleQuote);
}